

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<void>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_helpers_each::emptySequence()::__0,int_const&,int&>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_70098e60_for_fn fn,int *args,int *args_1)

{
  int *args_local_1;
  int *args_local;
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  anon_class_8_1_70098e60_for_fn fn_local;
  
  resolve_local = (QPromiseResolve<void> *)fn.values;
  QtPromise::QPromise<QList<int>_>::
  each<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp:54:46)>
  ::anon_class_8_1_3fcf6586::anon_class_8_1_70098e60_for_fn::operator()
            ((anon_class_8_1_70098e60_for_fn *)&resolve_local,*args,(ulong)(uint)*args_1);
  QtPromise::QPromiseResolve<void>::operator()(resolve);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }